

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaTargetGenerator::WriteObjectBuildStatements(cmNinjaTargetGenerator *this)

{
  _Rb_tree_node_base *lang;
  Value *this_00;
  cmMakefile *this_01;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  cmGeneratorTarget *this_02;
  _Alloc_hider _Var3;
  pointer ppcVar4;
  bool bVar5;
  TargetType targetType;
  cmGeneratedFileStream *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  MapToNinjaPathImpl MVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  cmGlobalNinjaGenerator *pcVar13;
  _Base_ptr p_Var14;
  Value *pVVar15;
  pointer ppcVar16;
  cmCustomCommand *pcVar17;
  pointer ppcVar18;
  string local_468;
  string *local_448;
  pointer local_440;
  cmCustomCommand *cc;
  _Alloc_hider _Stack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [10];
  string targetSwiftDepsPath;
  string mapFilePath;
  string local_348;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_2e8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8 [2];
  cmNinjaDeps local_288 [17];
  Value local_e0;
  Value local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar6 = GetBuildFileStream(this);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar6);
  pcVar6 = GetBuildFileStream(this);
  poVar7 = std::operator<<((ostream *)pcVar6,"# Object build statements for ");
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar8 = cmState::GetTargetTypeName(targetType);
  poVar7 = std::operator<<(poVar7,pcVar8);
  poVar7 = std::operator<<(poVar7," target ");
  GetTargetName_abi_cxx11_((string *)&customCommands,this);
  poVar7 = std::operator<<(poVar7,(string *)&customCommands);
  std::operator<<(poVar7,"\n\n");
  std::__cxx11::string::~string((string *)&customCommands);
  this_01 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&customCommands,"CMAKE_BUILD_TYPE",(allocator<char> *)&cc);
  psVar9 = cmMakefile::GetSafeDefinition(this_01,(string *)&customCommands);
  std::__cxx11::string::~string((string *)&customCommands);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448 = psVar9;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,psVar9);
  ppcVar4 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar18 = customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar4;
      ppcVar18 = ppcVar18 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar18);
    cmLocalNinjaGenerator::AddCustomCommandTarget
              (this->LocalGenerator,cc,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              (&this->CustomCommands,&cc);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  psVar9 = local_448;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,local_448);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,&customCommands,
             &((this->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,psVar9);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            ((this->OSXBundleGenerator)._M_t.
             super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
             .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl,&customCommands,
             &((this->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  cc = (cmCustomCommand *)0x0;
  _Stack_430._M_p = (pointer)0x0;
  local_428[0]._M_allocated_capacity = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc,psVar9);
  _Var3._M_p = _Stack_430._M_p;
  for (pcVar17 = cc; pcVar17 != (cmCustomCommand *)_Var3._M_p;
      pcVar17 = (cmCustomCommand *)
                &(pcVar17->Outputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
    GetSourceFilePath_abi_cxx11_
              ((string *)&customCommands,this,
               (cmSourceFile *)
               (pcVar17->Outputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Objects,
               (string *)&customCommands);
    std::__cxx11::string::~string((string *)&customCommands);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"phony",(allocator<char> *)&cc);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&customCommands,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  GetTargetName_abi_cxx11_(&local_468,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc,
                 "Order-only phony target for ",&local_468);
  std::__cxx11::string::operator=((string *)&customCommands,(string *)&cc);
  std::__cxx11::string::~string((string *)&cc);
  std::__cxx11::string::~string((string *)&local_468);
  OrderDependsTargetForTarget_abi_cxx11_((string *)&cc,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_2e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc);
  std::__cxx11::string::~string((string *)&cc);
  cmLocalNinjaGenerator::AppendTargetDepends
            (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_288,
             DependOnTargetOrdering);
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (local_288,&this->ExtraFiles);
  local_440 = (this->CustomCommands).
              super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar16 = (this->CustomCommands).
                  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppcVar16 != local_440;
      ppcVar16 = ppcVar16 + 1) {
    pcVar17 = *ppcVar16;
    psVar9 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator)
    ;
    std::__cxx11::string::string((string *)&local_90,(string *)psVar9);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)&cc,pcVar17,&local_90,
               (cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::~string((string *)&local_90);
    pvVar10 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_((cmCustomCommandGenerator *)&cc);
    pvVar11 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_((cmCustomCommandGenerator *)&cc);
    _Var1._M_current =
         (pvVar10->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current =
         (pvVar10->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    MVar12.GG = GetGlobalGenerator(this);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              (_Var1,_Var2,local_288,MVar12);
    _Var1._M_current =
         (pvVar11->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var2._M_current =
         (pvVar11->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    MVar12.GG = GetGlobalGenerator(this);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              (_Var1,_Var2,local_288,MVar12);
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&cc);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_288[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_288[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  psVar9 = local_448;
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_288[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_288[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(local_288,(const_iterator)__first._M_current,
          (const_iterator)
          local_288[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  if (local_288[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_288[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cc = (cmCustomCommand *)local_428;
    _Stack_430._M_p = (pointer)0x0;
    local_428[0]._M_allocated_capacity = local_428[0]._M_allocated_capacity & 0xffffffffffffff00;
    cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator)
    ;
    std::__cxx11::string::append((string *)&cc);
    std::__cxx11::string::append((char *)&cc);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xc])
              (&local_468,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    std::__cxx11::string::append((string *)&cc);
    std::__cxx11::string::~string((string *)&local_468);
    ConvertToNinjaPath(&local_468,this,(string *)&cc);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_288,
               &local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&cc);
  }
  pcVar13 = GetGlobalGenerator(this);
  pcVar6 = GetBuildFileStream(this);
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar13,(ostream *)pcVar6,(cmNinjaBuild *)&customCommands,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&customCommands);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,psVar9);
  ppcVar4 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar18 = customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar4;
      ppcVar18 = ppcVar18 + 1) {
    WriteObjectBuildStatement(this,*ppcVar18);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &customCommands);
  for (p_Var14 = (this->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var14 != &(this->DDIFiles)._M_t._M_impl.super__Rb_tree_header;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    lang = p_Var14 + 1;
    LanguageDyndepRule(&local_50,this,(string *)lang);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&customCommands,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GetDyndepFilePath((string *)&cc,this,(string *)lang);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_2e8,(string *)&cc);
    std::__cxx11::string::~string((string *)&cc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_2b8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(p_Var14 + 2));
    WriteTargetDependInfo(this,(string *)lang);
    cmLocalNinjaGenerator::AppendTargetDepends
              (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_288,
               DependOnTargetArtifact);
    pcVar13 = GetGlobalGenerator(this);
    pcVar6 = GetBuildFileStream(this);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar13,(ostream *)pcVar6,(cmNinjaBuild *)&customCommands,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&customCommands);
  }
  pcVar6 = GetBuildFileStream(this);
  std::operator<<((ostream *)pcVar6,"\n");
  this_00 = &this->SwiftOutputMap;
  bVar5 = Json::Value::empty(this_00);
  if (!bVar5) {
    cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
              ((string *)&cc,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &customCommands,(string *)&cc,"/output-file-map.json");
    ConvertToNinjaPath(&mapFilePath,this,(string *)&customCommands);
    std::__cxx11::string::~string((string *)&customCommands);
    std::__cxx11::string::~string((string *)&cc);
    this_02 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&customCommands,"Swift_DEPENDENCIES_FILE",(allocator<char> *)&cc);
    pcVar8 = cmGeneratorTarget::GetProperty(this_02,(string *)&customCommands);
    std::__cxx11::string::~string((string *)&customCommands);
    if (pcVar8 == (char *)0x0) {
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_348,this_02);
      std::operator+(&local_468,&local_348,"/");
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(this_02);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc,
                     &local_468,psVar9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &customCommands,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cc,
                     ".swiftdeps");
      ConvertToNinjaPath(&targetSwiftDepsPath,this,(string *)&customCommands);
      std::__cxx11::string::~string((string *)&customCommands);
      std::__cxx11::string::~string((string *)&cc);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_348);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetSwiftDepsPath,pcVar8,(allocator<char> *)&customCommands);
    }
    Json::Value::Value((Value *)&cc,objectValue);
    Json::Value::Value(&local_b8,&targetSwiftDepsPath);
    pVVar15 = Json::Value::operator[]((Value *)&cc,"swift-dependencies");
    Json::Value::operator=(pVVar15,&local_b8);
    Json::Value::~Value(&local_b8);
    Json::Value::Value(&local_e0,(Value *)&cc);
    pVVar15 = Json::Value::operator[](this_00,"");
    Json::Value::operator=(pVVar15,&local_e0);
    Json::Value::~Value(&local_e0);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&customCommands,&mapFilePath,false,None);
    Json::operator<<((ostream *)&customCommands,this_00);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&customCommands);
    Json::Value::~Value((Value *)&cc);
    std::__cxx11::string::~string((string *)&targetSwiftDepsPath);
    std::__cxx11::string::~string((string *)&mapFilePath);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements()
{
  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  this->GetBuildFileStream()
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  {
    std::vector<cmSourceFile const*> customCommands;
    this->GeneratorTarget->GetCustomCommands(customCommands, config);
    for (cmSourceFile const* sf : customCommands) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      // Record the custom commands for this target. The container is used
      // in WriteObjectBuildStatement when called in a loop below.
      this->CustomCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->MacOSXContentGenerator.get());
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->MacOSXContentGenerator.get());
  }
  {
    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      this->Objects.push_back(this->GetSourceFilePath(sf));
    }
  }

  {
    cmNinjaBuild build("phony");
    build.Comment = "Order-only phony target for " + this->GetTargetName();
    build.Outputs.push_back(this->OrderDependsTargetForTarget());

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cmAppend(orderOnlyDeps, this->ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    for (cmCustomCommand const* cc : this->CustomCommands) {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      std::transform(ccoutputs.begin(), ccoutputs.end(),
                     std::back_inserter(orderOnlyDeps), MapToNinjaPath());
      std::transform(ccbyproducts.begin(), ccbyproducts.end(),
                     std::back_inserter(orderOnlyDeps), MapToNinjaPath());
    }

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      // Any path that always exists will work here.  It would be nice to
      // use just "." but that is not supported by Ninja < 1.7.
      std::string tgtDir;
      tgtDir += this->LocalGenerator->GetCurrentBinaryDirectory();
      tgtDir += "/";
      tgtDir +=
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }

  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);
    for (cmSourceFile const* sf : objectSources) {
      this->WriteObjectBuildStatement(sf);
    }
  }

  for (auto const& langDDIFiles : this->DDIFiles) {
    std::string const& language = langDDIFiles.first;
    cmNinjaDeps const& ddiFiles = langDDIFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language));
    build.Outputs.push_back(this->GetDyndepFilePath(language));
    build.ExplicitDeps = ddiFiles;

    this->WriteTargetDependInfo(language);

    // Make sure dyndep files for all our dependencies have already
    // been generated so that the '<LANG>Modules.json' files they
    // produced as side-effects are available for us to read.
    // Ideally we should depend on the '<LANG>Modules.json' files
    // from our dependencies directly, but we don't know which of
    // our dependencies produces them.  Fixing this will require
    // refactoring the Ninja generator to generate targets in
    // dependency order so that we can collect the needed information.
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, build.OrderOnlyDeps, DependOnTargetArtifact);

    this->GetGlobalGenerator()->WriteBuild(this->GetBuildFileStream(), build);
  }

  this->GetBuildFileStream() << "\n";

  if (!this->SwiftOutputMap.empty()) {
    std::string const mapFilePath = this->ConvertToNinjaPath(
      this->GeneratorTarget->GetSupportDirectory() + "/output-file-map.json");
    std::string const targetSwiftDepsPath = [this]() -> std::string {
      cmGeneratorTarget const* target = this->GeneratorTarget;
      if (const char* name = target->GetProperty("Swift_DEPENDENCIES_FILE")) {
        return name;
      }
      return this->ConvertToNinjaPath(target->GetSupportDirectory() + "/" +
                                      target->GetName() + ".swiftdeps");
    }();

    // build the global target dependencies
    // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
    Json::Value deps(Json::objectValue);
    deps["swift-dependencies"] = targetSwiftDepsPath;
    this->SwiftOutputMap[""] = deps;

    cmGeneratedFileStream output(mapFilePath);
    output << this->SwiftOutputMap;
  }
}